

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O3

void __thiscall
Atari::ST::ConcreteMachine::ConcreteMachine
          (ConcreteMachine *this,Target *target,ROMFetcher *rom_fetcher)

{
  Video *this_00;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *this_01;
  AsyncTaskQueue<false,_true,_void> *this_02;
  AY38910<false> *sample_source;
  atomic_flag *paVar1;
  ACIA *this_03;
  ACIA *this_04;
  Observer *pOVar2;
  Source *pSVar3;
  MFP68901 *this_05;
  DMAController *this_06;
  __atomic_flag_data_type _Var4;
  _Rb_tree_color _Var5;
  uint8_t *buffer;
  HalfCycles HVar6;
  uint16_t *ram;
  pointer puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  _Base_ptr p_Var11;
  bool bVar12;
  uint uVar13;
  undefined4 *puVar14;
  _Base_ptr p_Var15;
  long lVar16;
  char *__function;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  ulong uVar19;
  _Base_ptr p_Var20;
  size_type __new_size;
  ulong uVar21;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  local_f0;
  WrappedInt<Cycles> local_e0;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c8;
  LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false> *local_c0;
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *local_b8;
  Target *local_b0;
  undefined1 local_a8 [8];
  _Rb_tree_node_base _Stack_a0;
  size_t local_80;
  IntelligentKeyboard *local_78;
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *local_70;
  AsyncTaskQueue<false,_true,_void> *local_68;
  AY38910SampleSource<false> *local_60;
  Request local_58;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_00596700;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00591648;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00591610;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_00590d68;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&PTR___cxa_pure_virtual_00594b68;
  (this->super_JoystickMachine)._vptr_JoystickMachine =
       (_func_int **)&PTR___cxa_pure_virtual_00590d80;
  p_Var20 = (_Base_ptr)(local_a8 + 8);
  _Stack_a0._M_parent = (_Base_ptr)0x0;
  local_a8 = (undefined1  [8])0x0;
  _Stack_a0._0_8_ = (Video *)0x0;
  local_80 = 0;
  local_b0 = target;
  _Stack_a0._M_left = p_Var20;
  _Stack_a0._M_right = p_Var20;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_a8);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_a8);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005962a0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00596368;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005963b0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005963e8;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_00596400;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00596418;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00596430;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00596460;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005964a0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_005964b8;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_005964d0;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_005964e8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00596500;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00596518;
  (this->super_PortHandler)._vptr_PortHandler = (_func_int **)&PTR_get_port_input_00596530;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00596550;
  (this->super_RangeObserver)._vptr_RangeObserver = (_func_int **)&DAT_00596570;
  CPU::MC68000::ProcessorBase::ProcessorBase(&(this->mc68000_).super_ProcessorBase);
  (this->mc68000_).bus_handler_ = this;
  (this->bus_phase_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_00596720;
  this_00 = &(this->video_).object_;
  ST::Video::Video(this_00);
  local_e0.length_ = (IntType)&this->video_;
  (this->video_).time_since_update_ = (WrappedInt<HalfCycles>)0x0;
  (this->video_).time_until_event_ = (WrappedInt<HalfCycles>)0x0;
  (this->video_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->video_).is_flushed_ = true;
  (this->video_).did_flush_ = false;
  (this->video_).clocking_preference_ = JustInTime;
  (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  local_b8 = (JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)&this->mfp_;
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::JustInTimeActor<>
            ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)local_b8)
  ;
  this_01 = &this->keyboard_acia_;
  local_a8 = (undefined1  [8])0x7a120;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (this_01,(Cycles *)local_a8);
  local_d8 = &this->midi_acia_;
  local_a8 = (undefined1  [8])0x7a120;
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (local_d8,(Cycles *)local_a8);
  this_02 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_02);
  sample_source = &this->ay_;
  local_68 = this_02;
  GI::AY38910::AY38910SampleSource<false>::AY38910SampleSource
            (&sample_source->super_AY38910SampleSource<false>,YM2149F,this_02);
  (this->ay_).super_SampleSource<GI::AY38910::AY38910<false>,_false,_4>.master_divider_ = 0;
  local_c0 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>;
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            ((PullLowpass<GI::AY38910::AY38910<false>_> *)local_c0,sample_source);
  (this->cycles_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  local_70 = &this->dma_;
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::JustInTimeActor<>(local_70);
  (this->cycles_since_ikbd_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  LOCK();
  paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
  _Var4 = (paVar1->super___atomic_flag_base)._M_i;
  (paVar1->super___atomic_flag_base)._M_i = true;
  UNLOCK();
  if (_Var4 == false) {
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(this_01);
    LOCK();
    (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    LOCK();
    paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
    _Var4 = (paVar1->super___atomic_flag_base)._M_i;
    (paVar1->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var4 == false) {
      JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(this_01);
      LOCK();
      (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      local_78 = &this->ikbd_;
      IntelligentKeyboard::IntelligentKeyboard
                (local_78,&(this->keyboard_acia_).object_.transmit,
                 &(this->keyboard_acia_).object_.receive);
      local_c8 = &this->ram_;
      local_d0 = &this->rom_;
      (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined1 (*) [16])
       &(this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this->rom_start_ = 0;
      this->may_defer_acias_ = true;
      this->keyboard_needs_clock_ = false;
      this->mfp_is_realtime_ = false;
      this->dma_clocking_preference_ = None;
      this->video_interrupts_pending_ = 0;
      this->previous_hsync_ = false;
      this->previous_vsync_ = false;
      (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
           (_func_int **)&PTR_mapped_key_for_key_00596bd8;
      (this->super_TimedMachine).clock_rate_ = 8021247.0;
      Outputs::Speaker::
      LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>::
      set_input_rate(local_c0,2005311.8);
      __new_size = 0x400000;
      if (local_b0->memory_size != FourMegabytes) {
        __new_size = (ulong)(local_b0->memory_size == OneMegabyte) * 0x80000 + 0x80000;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_c8,__new_size);
      buffer = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Memory::Fuzz(buffer,(long)(this->ram_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)buffer);
      LOCK();
      paVar1 = &(this->video_).flush_concurrency_check_;
      _Var4 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var4 != false) {
LAB_002fd4d6:
        __function = 
        "auto JustInTimeActor<Atari::ST::Video>::operator->() [T = Atari::ST::Video, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
        ;
        goto LAB_002fd519;
      }
      if ((this->video_).is_flushed_ == false) {
        (this->video_).is_flushed_ = true;
        (this->video_).did_flush_ = true;
        HVar6.super_WrappedInt<HalfCycles>.length_ =
             (WrappedInt<HalfCycles>)
             (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
        (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
        ST::Video::run_for(this_00,HVar6);
      }
      LOCK();
      (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      local_a8 = (undefined1  [8])local_e0.length_;
      ram = (uint16_t *)
            (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      _Stack_a0._0_8_ = this_00;
      ST::Video::set_ram(this_00,ram,
                         (ulong)((long)(this->ram_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ram) >> 1)
      ;
      std::
      unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_a8);
      ROM::Request::Request(&local_58,AtariSTTOS100,false);
      if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*rom_fetcher->_M_invoker)
                ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_a8,(_Any_data *)rom_fetcher,&local_58);
      bVar12 = ROM::Request::validate(&local_58,(Map *)local_a8);
      if (!bVar12) {
        puVar14 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar14 = 0;
        __cxa_throw(puVar14,&ROMMachine::Error::typeinfo,0);
      }
      p_Var18 = p_Var20;
      p_Var11 = _Stack_a0._M_parent;
      if (_Stack_a0._M_parent != (_Base_ptr)0x0) {
        do {
          p_Var15 = p_Var11;
          p_Var17 = p_Var18;
          _Var5 = p_Var15[1]._M_color;
          p_Var18 = p_Var15;
          if ((int)_Var5 < 0x26) {
            p_Var18 = p_Var17;
          }
          p_Var11 = (&p_Var15->_M_left)[(int)_Var5 < 0x26];
        } while ((&p_Var15->_M_left)[(int)_Var5 < 0x26] != (_Base_ptr)0x0);
        if (p_Var18 != p_Var20) {
          if ((int)_Var5 < 0x26) {
            p_Var15 = p_Var17;
          }
          if ((int)p_Var15[1]._M_color < 0x27) {
            p_Var20 = p_Var18;
          }
        }
      }
      local_60 = &sample_source->super_AY38910SampleSource<false>;
      Memory::PackBigEndian16
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var20[1]._M_parent,
                 local_d0);
      puVar7 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (uint)((ulong)((long)(this->ram_).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >>
                     0x10);
      if ((int)uVar13 < 1) {
        uVar13 = 0;
LAB_002fce20:
        auVar10 = _DAT_00463a50;
        auVar9 = _DAT_00463a40;
        auVar8 = _DAT_00463a30;
        uVar21 = (ulong)(uVar13 & 0x7fffffff);
        lVar16 = 0x3f - uVar21;
        auVar26._8_4_ = (int)lVar16;
        auVar26._0_8_ = lVar16;
        auVar26._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar19 = 0;
        auVar26 = auVar26 ^ _DAT_00463a50;
        do {
          auVar24._8_4_ = (int)uVar19;
          auVar24._0_8_ = uVar19;
          auVar24._12_4_ = (int)(uVar19 >> 0x20);
          auVar22 = (auVar24 | auVar9) ^ auVar10;
          iVar23 = auVar26._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar23 && auVar26._0_4_ < auVar22._0_4_ ||
                      iVar23 < auVar22._4_4_) & 1)) {
            this->memory_map_[uVar21 + uVar19] = Floating;
          }
          if ((auVar22._12_4_ != auVar26._12_4_ || auVar22._8_4_ <= auVar26._8_4_) &&
              auVar22._12_4_ <= auVar26._12_4_) {
            this->memory_map_[uVar21 + uVar19 + 1] = Floating;
          }
          auVar24 = (auVar24 | auVar8) ^ auVar10;
          iVar27 = auVar24._4_4_;
          if (iVar27 <= iVar23 && (iVar27 != iVar23 || auVar24._0_4_ <= auVar26._0_4_)) {
            this->memory_map_[uVar21 + uVar19 + 2] = Floating;
            this->memory_map_[uVar21 + uVar19 + 3] = Floating;
          }
          uVar19 = uVar19 + 4;
        } while ((0x43 - uVar21 & 0xfffffffffffffffc) != uVar19);
        uVar13 = 0x40;
LAB_002fcf36:
        auVar10 = _DAT_00463a50;
        auVar9 = _DAT_00463a40;
        auVar8 = _DAT_00463a30;
        uVar21 = (ulong)(uVar13 & 0x7fffffff);
        lVar16 = 0xfe - uVar21;
        auVar22._8_4_ = (int)lVar16;
        auVar22._0_8_ = lVar16;
        auVar22._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar19 = 0;
        auVar22 = auVar22 ^ _DAT_00463a50;
        do {
          auVar25._8_4_ = (int)uVar19;
          auVar25._0_8_ = uVar19;
          auVar25._12_4_ = (int)(uVar19 >> 0x20);
          auVar26 = (auVar25 | auVar9) ^ auVar10;
          iVar23 = auVar22._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar23 && auVar22._0_4_ < auVar26._0_4_ ||
                      iVar23 < auVar26._4_4_) & 1)) {
            this->memory_map_[uVar21 + uVar19] = Unassigned;
          }
          if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
              auVar26._12_4_ <= auVar22._12_4_) {
            this->memory_map_[uVar21 + uVar19 + 1] = Unassigned;
          }
          auVar26 = (auVar25 | auVar8) ^ auVar10;
          iVar27 = auVar26._4_4_;
          if (iVar27 <= iVar23 && (iVar27 != iVar23 || auVar26._0_4_ <= auVar22._0_4_)) {
            this->memory_map_[uVar21 + uVar19 + 2] = Unassigned;
            this->memory_map_[uVar21 + uVar19 + 3] = Unassigned;
          }
          uVar19 = uVar19 + 4;
        } while ((0x102 - uVar21 & 0xfffffffffffffffc) != uVar19);
      }
      else {
        memset(this->memory_map_,0,(ulong)(uVar13 & 0x7fffffff) << 2);
        if (uVar13 < 0x40) goto LAB_002fce20;
        if (uVar13 < 0xff) goto LAB_002fcf36;
      }
      this->rom_start_ = 0xfc0000;
      this->memory_map_[0xfe] = ROM;
      this->memory_map_[0xff] = IO;
      this->memory_map_[0xfa] = Cartridge;
      this->memory_map_[0xfb] = Cartridge;
      this->memory_map_[0xfc] = ROM;
      this->memory_map_[0xfd] = ROM;
      *(undefined8 *)puVar7 =
           *(undefined8 *)
            (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      LOCK();
      paVar1 = &(this->midi_acia_).flush_concurrency_check_;
      _Var4 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var4 == false) {
        JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(local_d8);
        LOCK();
        (this->midi_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        this_03 = &(this->midi_acia_).object_;
        Motorola::ACIA::ACIA::set_interrupt_delegate(this_03,&this->super_InterruptDelegate);
        LOCK();
        paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
        _Var4 = (paVar1->super___atomic_flag_base)._M_i;
        (paVar1->super___atomic_flag_base)._M_i = true;
        UNLOCK();
        if (_Var4 == false) {
          JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(this_01);
          this_04 = &(this->keyboard_acia_).object_;
          LOCK();
          (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
          UNLOCK();
          Motorola::ACIA::ACIA::set_interrupt_delegate(this_04,&this->super_InterruptDelegate);
          LOCK();
          paVar1 = &(this->midi_acia_).flush_concurrency_check_;
          _Var4 = (paVar1->super___atomic_flag_base)._M_i;
          (paVar1->super___atomic_flag_base)._M_i = true;
          UNLOCK();
          if (_Var4 == false) {
            JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(local_d8);
            LOCK();
            (this->midi_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
            UNLOCK();
            pOVar2 = &this->super_Observer;
            (this->midi_acia_).object_.super_Source.observer_ = pOVar2;
            uVar13 = (**(this->midi_acia_).object_.super_Source._vptr_Source)(this_03);
            (**pOVar2->_vptr_Observer)(pOVar2,this_03,(ulong)uVar13);
            LOCK();
            paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
            _Var4 = (paVar1->super___atomic_flag_base)._M_i;
            (paVar1->super___atomic_flag_base)._M_i = true;
            UNLOCK();
            if (_Var4 == false) {
              JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(this_01);
              LOCK();
              (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
              UNLOCK();
              (this->keyboard_acia_).object_.super_Source.observer_ = pOVar2;
              uVar13 = (**(this->keyboard_acia_).object_.super_Source._vptr_Source)(this_04);
              (**pOVar2->_vptr_Observer)(pOVar2,this_04,(ulong)uVar13);
              pSVar3 = &(this->ikbd_).super_Source;
              (this->ikbd_).super_Source.observer_ = pOVar2;
              uVar13 = (**(this->ikbd_).super_Source._vptr_Source)(pSVar3);
              (**pOVar2->_vptr_Observer)(pOVar2,pSVar3,(ulong)uVar13);
              LOCK();
              paVar1 = &(this->mfp_).flush_concurrency_check_;
              _Var4 = (paVar1->super___atomic_flag_base)._M_i;
              (paVar1->super___atomic_flag_base)._M_i = true;
              UNLOCK();
              if (_Var4 == false) {
                if ((this->mfp_).is_flushed_ == false) {
                  (this->mfp_).is_flushed_ = true;
                  (this->mfp_).did_flush_ = true;
                  uVar19 = (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                  (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
                       (long)uVar19 % 0x28cc55;
                  if (0x28cc54 < (long)uVar19) {
                    Motorola::MFP68901::MFP68901::run_for
                              (&(this->mfp_).object_,(HalfCycles)(uVar19 / 0x28cc55));
                  }
                }
                LOCK();
                (this->mfp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                UNLOCK();
                this_05 = &(this->mfp_).object_;
                local_f0._M_t.
                super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                ._M_t.
                super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                .
                super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                .
                super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                ._M_head_impl.actor_ =
                     (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                      )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                        )local_b8;
                (this->mfp_).object_.super_Source.observer_ = pOVar2;
                local_f0._M_t.
                super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                ._M_t.
                super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = (Video *)this_05;
                uVar13 = (**(this->mfp_).object_.super_Source._vptr_Source)(this_05);
                (**pOVar2->_vptr_Observer)(pOVar2,this_05,(ulong)uVar13);
                std::
                unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                               *)&local_f0);
                LOCK();
                paVar1 = &(this->dma_).flush_concurrency_check_;
                _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                (paVar1->super___atomic_flag_base)._M_i = true;
                UNLOCK();
                if (_Var4 == false) {
                  if ((this->dma_).is_flushed_ == false) {
                    (this->dma_).is_flushed_ = true;
                    (this->dma_).did_flush_ = true;
                    HVar6.super_WrappedInt<HalfCycles>.length_ =
                         (WrappedInt<HalfCycles>)
                         (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                    (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
                    DMAController::run_for(&(this->dma_).object_,HVar6);
                  }
                  LOCK();
                  (this->dma_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                  UNLOCK();
                  pSVar3 = &(this->dma_).object_.super_Source;
                  (this->dma_).object_.super_Source.observer_ = pOVar2;
                  uVar13 = (**(this->dma_).object_.super_Source._vptr_Source)(pSVar3);
                  (**pOVar2->_vptr_Observer)(pOVar2,pSVar3,(ulong)uVar13);
                  LOCK();
                  paVar1 = &(this->mfp_).flush_concurrency_check_;
                  _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                  (paVar1->super___atomic_flag_base)._M_i = true;
                  UNLOCK();
                  if (_Var4 != false) goto LAB_002fd4ed;
                  if ((this->mfp_).is_flushed_ == false) {
                    (this->mfp_).is_flushed_ = true;
                    (this->mfp_).did_flush_ = true;
                    uVar19 = (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                    (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
                         (long)uVar19 % 0x28cc55;
                    if (0x28cc54 < (long)uVar19) {
                      Motorola::MFP68901::MFP68901::run_for(this_05,(HalfCycles)(uVar19 / 0x28cc55))
                      ;
                    }
                  }
                  LOCK();
                  (this->mfp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                  UNLOCK();
                  local_f0._M_t.
                  super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  .
                  super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  .
                  super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                  ._M_head_impl.actor_ =
                       (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                        )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                          )local_b8;
                  local_f0._M_t.
                  super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                  .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = (Video *)this_05;
                  Motorola::MFP68901::MFP68901::set_interrupt_delegate
                            (this_05,&this->super_InterruptDelegate);
                  std::
                  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                  ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                                 *)&local_f0);
                  LOCK();
                  paVar1 = &(this->dma_).flush_concurrency_check_;
                  _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                  (paVar1->super___atomic_flag_base)._M_i = true;
                  UNLOCK();
                  if (_Var4 == false) {
                    this_06 = &(this->dma_).object_;
                    if ((this->dma_).is_flushed_ == false) {
                      (this->dma_).is_flushed_ = true;
                      (this->dma_).did_flush_ = true;
                      HVar6.super_WrappedInt<HalfCycles>.length_ =
                           (WrappedInt<HalfCycles>)
                           (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                      (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
                      DMAController::run_for(this_06,HVar6);
                    }
                    LOCK();
                    (this->dma_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                    UNLOCK();
                    DMAController::set_delegate(this_06,&this->super_Delegate);
                    GI::AY38910::AY38910SampleSource<false>::set_port_handler
                              (local_60,&this->super_PortHandler);
                    set_gpip_input(this);
                    LOCK();
                    paVar1 = &(this->video_).flush_concurrency_check_;
                    _Var4 = (paVar1->super___atomic_flag_base)._M_i;
                    (paVar1->super___atomic_flag_base)._M_i = true;
                    UNLOCK();
                    if (_Var4 == false) {
                      if ((this->video_).is_flushed_ == false) {
                        (this->video_).is_flushed_ = true;
                        (this->video_).did_flush_ = true;
                        HVar6.super_WrappedInt<HalfCycles>.length_ =
                             (WrappedInt<HalfCycles>)
                             (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
                        (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
                        ST::Video::run_for(this_00,HVar6);
                      }
                      LOCK();
                      (this->video_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
                      UNLOCK();
                      local_f0._M_t.
                      super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      .
                      super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      .
                      super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                      ._M_head_impl.actor_ =
                           (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                            )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
                              )local_e0.length_;
                      local_f0._M_t.
                      super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = this_00;
                      ST::Video::set_range_observer(this_00,&this->super_RangeObserver);
                      std::
                      unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                      ::~unique_ptr(&local_f0);
                      insert_media(this,&(local_b0->super_Target).media);
                      std::
                      _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                   *)local_a8);
                      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
                                (&local_58.node.children);
                      return;
                    }
                    goto LAB_002fd4d6;
                  }
                }
                __function = 
                "auto JustInTimeActor<Atari::ST::DMAController>::operator->() [T = Atari::ST::DMAController, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                ;
              }
              else {
LAB_002fd4ed:
                __function = 
                "auto JustInTimeActor<Motorola::MFP68901::MFP68901, HalfCycles, 819200, 2673749>::operator->() [T = Motorola::MFP68901::MFP68901, LocalTimeScale = HalfCycles, multiplier = 819200, divider = 2673749]"
                ;
              }
              goto LAB_002fd519;
            }
          }
        }
      }
    }
  }
  __function = 
  "auto JustInTimeActor<Motorola::ACIA::ACIA, HalfCycles, 16>::operator->() [T = Motorola::ACIA::ACIA, LocalTimeScale = HalfCycles, multiplier = 16, divider = 1]"
  ;
LAB_002fd519:
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,__function);
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			mc68000_(*this),
			keyboard_acia_(Cycles(500000)),
			midi_acia_(Cycles(500000)),
			ay_(GI::AY38910::Personality::YM2149F, audio_queue_),
			speaker_(ay_),
			ikbd_(keyboard_acia_->transmit, keyboard_acia_->receive) {
			set_clock_rate(CLOCK_RATE);
			speaker_.set_input_rate(float(CLOCK_RATE) / 4.0f);

			switch(target.memory_size) {
				default:
				case Target::MemorySize::FiveHundredAndTwelveKilobytes:
					ram_.resize(512 * 1024);
				break;
				case Target::MemorySize::OneMegabyte:
					ram_.resize(1024 * 1024);
				break;
				case Target::MemorySize::FourMegabytes:
					ram_.resize(4 * 1024 * 1024);
				break;
			}
			Memory::Fuzz(ram_);

			video_->set_ram(
				reinterpret_cast<uint16_t *>(ram_.data()),
				ram_.size() >> 1
			);

			constexpr ROM::Name rom_name = ROM::Name::AtariSTTOS100;
			ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			Memory::PackBigEndian16(roms.find(rom_name)->second, rom_);

			// Set up basic memory map.
			int c = 0;
			for(; c < int(ram_.size() >> 16); ++c) memory_map_[c] = BusDevice::RAM;
			for(; c < 0x40; ++c) memory_map_[c] = BusDevice::Floating;
			for(; c < 0xff; ++c) memory_map_[c] = BusDevice::Unassigned;

			const bool is_early_tos = true;
			if(is_early_tos) {
				rom_start_ = 0xfc0000;
				for(c = 0xfc; c < 0xff; ++c) memory_map_[c] = BusDevice::ROM;
			} else {
				rom_start_ = 0xe00000;
				for(c = 0xe0; c < 0xe4; ++c) memory_map_[c] = BusDevice::ROM;
			}

			memory_map_[0xfa] = memory_map_[0xfb] = BusDevice::Cartridge;
			memory_map_[0xff] = BusDevice::IO;

			// Copy the first 8 bytes of ROM into RAM.
			reinstall_rom_vector();

			midi_acia_->set_interrupt_delegate(this);
			keyboard_acia_->set_interrupt_delegate(this);

			midi_acia_->set_clocking_hint_observer(this);
			keyboard_acia_->set_clocking_hint_observer(this);
			ikbd_.set_clocking_hint_observer(this);
			mfp_->set_clocking_hint_observer(this);
			dma_->set_clocking_hint_observer(this);

			mfp_->set_interrupt_delegate(this);
			dma_->set_delegate(this);
			ay_.set_port_handler(this);

			set_gpip_input();

			video_->set_range_observer(this);

			// Insert any supplied media.
			insert_media(target.media);
		}